

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O3

void __thiscall subprocess::detail::Streams::cleanup_fds(Streams *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->write_to_child_ != -1) && (this->read_from_parent_ != -1)) {
    close(this->write_to_child_);
  }
  if ((this->write_to_parent_ != -1) && (this->read_from_child_ != -1)) {
    close(this->read_from_child_);
  }
  if ((this->err_write_ == -1) || (this->err_read_ == -1)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    close(this->err_read_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cleanup_fds()
  {
    if (write_to_child_ != -1 && read_from_parent_ != -1) {
      close(write_to_child_);
    }
    if (write_to_parent_ != -1 && read_from_child_ != -1) {
      close(read_from_child_);
    }
    if (err_write_ != -1 && err_read_ != -1) {
      close(err_read_);
    }
  }